

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

void duckdb::BitStringAggOperation::
     Execute<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>>
               (BitAggState<duckdb::hugeint_t> *state,hugeint_t input,hugeint_t min)

{
  uint64_t uVar1;
  OutOfRangeException *this;
  bool bVar2;
  int64_t extraout_RDX;
  hugeint_t hVar3;
  idx_t val;
  ulong local_68;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  hugeint_t local_40;
  hugeint_t local_30;
  
  local_40.upper = min.upper;
  local_40.lower = min.lower;
  local_30.upper = input.upper;
  local_30.lower = input.lower;
  uVar1 = duckdb::hugeint_t::operator-(&local_30,&local_40);
  hVar3.upper = extraout_RDX;
  hVar3.lower = uVar1;
  bVar2 = duckdb::Hugeint::TryCast<unsigned_long>(hVar3,&local_68);
  if (bVar2) {
    duckdb::Bit::SetBit(&state->value,local_68,1);
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"Range too large for bitstring aggregation","");
  duckdb::OutOfRangeException::OutOfRangeException(this,(string *)local_60);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BitStringAggOperation::Execute(BitAggState<hugeint_t> &state, hugeint_t input, hugeint_t min) {
	idx_t val;
	if (Hugeint::TryCast(input - min, val)) {
		Bit::SetBit(state.value, val, 1);
	} else {
		throw OutOfRangeException("Range too large for bitstring aggregation");
	}
}